

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O2

vm_obj_id_t CVmObjFileName::create_from_url(char *str,size_t len)

{
  void *pvVar1;
  vm_obj_id_t vVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  char *__s;
  size_t len_00;
  long *plVar5;
  err_frame_t err_cur__;
  uint local_f8 [2];
  undefined8 local_f0;
  void *local_e8;
  __jmp_buf_tag local_e0;
  
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  local_f0 = *puVar3;
  uVar4 = _ZTW11G_err_frame();
  *(uint **)uVar4 = local_f8;
  local_f8[0] = _setjmp(&local_e0);
  if (local_f8[0] == 0) {
    __s = url_to_local(str,len,0);
    len_00 = strlen(__s);
    vVar2 = create_from_local(__s,len_00);
  }
  else {
    vVar2 = 0;
    __s = (char *)0x0;
  }
  if (-1 < (short)local_f8[0]) {
    local_f8[0] = local_f8[0] | 0x8000;
    lib_free_str(__s);
  }
  uVar4 = local_f0;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  *puVar3 = uVar4;
  if ((local_f8[0] & 0x4001) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar3 & 2) != 0) {
      plVar5 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar5 + 0x10));
    }
    pvVar1 = local_e8;
    plVar5 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar5 + 0x10) = pvVar1;
    err_rethrow();
  }
  if ((local_f8[0] & 2) != 0) {
    free(local_e8);
  }
  return vVar2;
}

Assistant:

vm_obj_id_t CVmObjFileName::create_from_url(VMG_ const char *str, size_t len)
{
    char *lcl = 0;
    vm_obj_id_t fn = VM_INVALID_OBJ;
    err_try
    {
        /* convert to local notation */
        lcl = url_to_local(vmg_ str, len, FALSE);

        /* create the FileName object */
        fn = create_from_local(vmg_ lcl, strlen(lcl));
    }